

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O1

expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::GetCrateDataType_abi_cxx11_
          (expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,crate *this,int32_t type_id)

{
  size_type sVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong *puVar10;
  CrateDataTypeId __val;
  uint uVar11;
  uint uVar12;
  int *__dest;
  pair<mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>,_mapbox::eternal::iterator<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>_>_>
  pVar13;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> arrmap;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
  tymap;
  ulong *local_510;
  ulong local_500;
  long lStack_4f8;
  ulong *local_4f0;
  undefined8 local_4e8;
  ulong local_4e0;
  long lStack_4d8;
  long *local_4d0 [2];
  long local_4c0 [2];
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> local_4b0;
  int local_3b8 [228];
  
  __dest = local_3b8;
  memcpy(__dest,&DAT_0047a5c8,0x390);
  memcpy(&local_4b0,&DAT_003fdbc8,0xf8);
  __val = (CrateDataTypeId)this;
  if ((int)__val < 0) {
    uVar12 = -__val;
    uVar11 = 1;
    if (9 < uVar12) {
      uVar7 = uVar12;
      uVar3 = 4;
      do {
        uVar11 = uVar3;
        if (uVar7 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001eb9b1;
        }
        if (uVar7 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001eb9b1;
        }
        if (uVar7 < 10000) goto LAB_001eb9b1;
        bVar2 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar3 = uVar11 + 4;
      } while (bVar2);
      uVar11 = uVar11 + 1;
    }
LAB_001eb9b1:
    local_4d0[0] = local_4c0;
    ::std::__cxx11::string::_M_construct((ulong)local_4d0,(char)uVar11 + '\x01');
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_4d0[0] + 1),uVar11,uVar12);
    pcVar8 = "Unknown type id: ";
  }
  else {
    uVar9 = 0x39;
    do {
      uVar4 = uVar9 >> 1;
      uVar5 = uVar4;
      if (__dest[uVar4 * 4] < (int)__val) {
        uVar5 = ~uVar4 + uVar9;
        __dest = __dest + uVar4 * 4 + 4;
      }
      uVar9 = uVar5;
    } while (uVar5 != 0);
    if ((__dest == (int *)&stack0xffffffffffffffd8) || ((int)__val < *__dest)) {
      __dest = (int *)&stack0xffffffffffffffd8;
    }
    if (__dest != (int *)&stack0xffffffffffffffd8) {
      local_4f0 = (ulong *)CONCAT44(local_4f0._4_4_,__val);
      pVar13 = mapbox::eternal::impl::
               map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>::
               equal_range(&local_4b0,(key_type *)&local_4f0);
      pcVar8 = *(char **)(__dest + 2);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.name = pcVar8;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.dtype_id = __val;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.supports_array = pVar13.second.pos.pos != pVar13.first.pos.pos;
      return __return_storage_ptr__;
    }
    uVar12 = 1;
    if (CRATE_DATA_TYPE_DOUBLE < __val) {
      uVar9 = (ulong)this & 0xffffffff;
      uVar11 = 4;
      do {
        uVar12 = uVar11;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_001eb9f9;
        }
        if (uVar7 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_001eb9f9;
        }
        if (uVar7 < 10000) goto LAB_001eb9f9;
        uVar9 = uVar9 / 10000;
        uVar11 = uVar12 + 4;
      } while (99999 < uVar7);
      uVar12 = uVar12 + 1;
    }
LAB_001eb9f9:
    local_4d0[0] = local_4c0;
    ::std::__cxx11::string::_M_construct((ulong)local_4d0,(char)uVar12);
    ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4d0[0],uVar12,__val);
    pcVar8 = "Unknown or unspported type id: ";
  }
  plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_4d0,0,(char *)0x0,(ulong)pcVar8);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_500 = *puVar10;
    lStack_4f8 = plVar6[3];
    local_510 = &local_500;
  }
  else {
    local_500 = *puVar10;
    local_510 = (ulong *)*plVar6;
  }
  local_4e0 = local_500;
  sVar1 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_510 == &local_500) {
    lStack_4d8 = lStack_4f8;
    local_4f0 = &local_4e0;
  }
  else {
    local_4f0 = local_510;
  }
  local_500 = local_500 & 0xffffffffffffff00;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = false;
  puVar10 = (ulong *)((long)&(__return_storage_ptr__->contained).
                             super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .field_0 + 0x10);
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value.name = (char *)puVar10;
  if (local_4f0 == &local_4e0) {
    *puVar10 = local_4e0;
    *(long *)((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x18) = lStack_4d8;
  }
  else {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.name = (char *)local_4f0;
    *(ulong *)((long)&(__return_storage_ptr__->contained).
                      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .field_0 + 0x10) = local_4e0;
  }
  (__return_storage_ptr__->contained).
  super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_error._M_string_length = sVar1;
  local_4e0 = local_4e0 & 0xffffffffffffff00;
  local_4e8 = 0;
  if (local_4d0[0] != local_4c0) {
    local_4f0 = &local_4e0;
    operator_delete(local_4d0[0],local_4c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<CrateDataType, std::string> GetCrateDataType(int32_t type_id) {
  // See <pxrUSD>/pxr/usd/usd/crateDataTypes.h

  // TODO: Use type name in value-types.hh and prim-types.hh?
  MAPBOX_ETERNAL_CONSTEXPR const auto tymap =
      mapbox::eternal::map<CrateDataTypeId, mapbox::eternal::string>({
          {CrateDataTypeId::CRATE_DATA_TYPE_INVALID, "Invalid"},  // 0
          {CrateDataTypeId::CRATE_DATA_TYPE_BOOL, "Bool"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UCHAR, "UChar"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT, "Int"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT, "UInt"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64, "Int64"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64, "UInt64"},

          {CrateDataTypeId::CRATE_DATA_TYPE_HALF, "Half"},
          {CrateDataTypeId::CRATE_DATA_TYPE_FLOAT, "Float"},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE, "Double"},

          {CrateDataTypeId::CRATE_DATA_TYPE_STRING, "String"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN, "Token"},
          {CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH, "AssetPath"},

          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D, "Matrix2d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D, "Matrix3d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D, "Matrix4d"},

          {CrateDataTypeId::CRATE_DATA_TYPE_QUATD, "Quatd"},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATF, "Quatf"},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATH, "Quath"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2D, "Vec2d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2F, "Vec2f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2H, "Vec2h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2I, "Vec2i"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3D, "Vec3d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3F, "Vec3f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3H, "Vec3h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3I, "Vec3i"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4D, "Vec4d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4F, "Vec4f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4H, "Vec4h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4I, "Vec4i"},

          // Non-array types.
          {CrateDataTypeId::CRATE_DATA_TYPE_DICTIONARY, "Dictionary"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_LIST_OP, "TokenListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_STRING_LIST_OP, "StringListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PATH_LIST_OP, "PathListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_REFERENCE_LIST_OP,
           "ReferenceListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT_LIST_OP, "IntListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64_LIST_OP, "Int64ListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT_LIST_OP, "UIntListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64_LIST_OP, "UInt64ListOp"},

          {CrateDataTypeId::CRATE_DATA_TYPE_PATH_VECTOR, "PathVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_VECTOR, "TokenVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_SPECIFIER, "Specifier"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PERMISSION, "Permission"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VARIABILITY, "Variability"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VARIANT_SELECTION_MAP,
           "VariantSelectionMap"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_SAMPLES, "TimeSamples"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD, "Payload"},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR, "DoubleVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_LAYER_OFFSET_VECTOR,
           "LayerOffsetVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_STRING_VECTOR, "StringVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VALUE_BLOCK, "ValueBlock"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VALUE, "Value"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE,
           "UnregisteredValue"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE_LIST_OP,
           "UnregisteredValueListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD_LIST_OP, "PayloadListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE, "TimeCode"},
      });

  // List up `supports array` type.
  // TODO: Use compile-time `set`
  MAPBOX_ETERNAL_CONSTEXPR const auto arrmap =
      mapbox::eternal::map<CrateDataTypeId, bool>({
          {CrateDataTypeId::CRATE_DATA_TYPE_BOOL, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UCHAR, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_HALF, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_FLOAT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_STRING, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_QUATD, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATF, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATH, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2I, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3I, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4I, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE, true},
      });

  if (type_id < 0) {
    return nonstd::make_unexpected("Unknown type id: " +
                                   std::to_string(type_id));
  }

  auto tyret = tymap.find(static_cast<CrateDataTypeId>(type_id));

  if (tyret == tymap.end()) {
    // Invalid or unsupported.
    return nonstd::make_unexpected("Unknown or unspported type id: " +
                                   std::to_string(type_id));
  }

  bool supports_array = arrmap.count(static_cast<CrateDataTypeId>(type_id));

  CrateDataType dst(tyret->second.data(), static_cast<CrateDataTypeId>(type_id),
                    supports_array);

  return std::move(dst);
}